

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O1

void TestStringToDoubleVarious(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  undefined8 uVar6;
  bool all_used;
  int processed;
  bool local_5;
  uint local_4;
  
  dVar5 = StrToD("",0x38,0.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"\", flags, 0.0, &processed, &all_used)";
    uVar6 = 0;
    uVar2 = 0x776;
LAB_0083e747:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar6,dVar5,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,pcVar1,pcVar3);
    abort();
  }
  if (local_5 == false) {
    uVar2 = 0x777;
LAB_0083e70e:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,"all_used");
    abort();
  }
  dVar5 = StrToD("",0x38,1.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    pcVar1 = "1.0";
    pcVar3 = "StrToD(\"\", flags, 1.0, &processed, &all_used)";
    uVar6 = 0x3ff0000000000000;
    uVar2 = 0x779;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x77a;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD("  ",0x38,0.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"  \", flags, 0.0, &processed, &all_used)";
    uVar6 = 0;
    uVar2 = 0x77c;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x77d;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD("  ",0x38,1.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    pcVar1 = "1.0";
    pcVar3 = "StrToD(\"  \", flags, 1.0, &processed, &all_used)";
    uVar6 = 0x3ff0000000000000;
    uVar2 = 0x77f;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x780;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD("42",0x38,0.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 42.0) || (NAN(dVar5))) {
    pcVar1 = "42.0";
    pcVar3 = "StrToD(\"42\", flags, 0.0, &processed, &all_used)";
    uVar6 = 0x4045000000000000;
    uVar2 = 0x782;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x783;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD(" + 42 ",0x38,0.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != 42.0) || (NAN(dVar5))) {
    pcVar1 = "42.0";
    pcVar3 = "StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)";
    uVar6 = 0x4045000000000000;
    uVar2 = 0x785;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x786;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD(" - 42 ",0x38,0.0,(int *)&local_4,&local_5,0);
  if ((dVar5 != -42.0) || (NAN(dVar5))) {
    pcVar1 = "-42.0";
    pcVar3 = "StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)";
    uVar6 = 0xc045000000000000;
    uVar2 = 0x788;
    goto LAB_0083e747;
  }
  if (local_5 == false) {
    uVar2 = 0x789;
    goto LAB_0083e70e;
  }
  dVar5 = StrToD("x",0x38,1.0,(int *)&local_4,&local_5,0);
  if (!NAN(dVar5)) {
    pcVar1 = "Double::NaN()";
    pcVar3 = "StrToD(\"x\", flags, 1.0, &processed, &all_used)";
    uVar6 = 0x7ff8000000000000;
    uVar2 = 0x78b;
    goto LAB_0083e747;
  }
  if (local_4 == 0) {
    dVar5 = StrToD(" x",0x38,1.0,(int *)&local_4,&local_5,0);
    if (!NAN(dVar5)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\" x\", flags, 1.0, &processed, &all_used)";
      uVar6 = 0x7ff8000000000000;
      uVar2 = 0x78e;
      goto LAB_0083e747;
    }
    if (local_4 == 0) {
      dVar5 = StrToD("42x",0x38,0.0,(int *)&local_4,&local_5,0);
      if (!NAN(dVar5)) {
        pcVar1 = "Double::NaN()";
        pcVar3 = "StrToD(\"42x\", flags, 0.0, &processed, &all_used)";
        uVar6 = 0x7ff8000000000000;
        uVar2 = 0x791;
        goto LAB_0083e747;
      }
      if (local_4 == 0) {
        dVar5 = StrToD("42 x",0x38,0.0,(int *)&local_4,&local_5,0);
        if (!NAN(dVar5)) {
          pcVar1 = "Double::NaN()";
          pcVar3 = "StrToD(\"42 x\", flags, 0.0, &processed, &all_used)";
          uVar6 = 0x7ff8000000000000;
          uVar2 = 0x794;
          goto LAB_0083e747;
        }
        if (local_4 == 0) {
          dVar5 = StrToD(" + 42 x",0x38,0.0,(int *)&local_4,&local_5,0);
          if (!NAN(dVar5)) {
            pcVar1 = "Double::NaN()";
            pcVar3 = "StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)";
            uVar6 = 0x7ff8000000000000;
            uVar2 = 0x797;
            goto LAB_0083e747;
          }
          if (local_4 == 0) {
            dVar5 = StrToD(" - 42 x",0x38,0.0,(int *)&local_4,&local_5,0);
            if (!NAN(dVar5)) {
              pcVar1 = "Double::NaN()";
              pcVar3 = "StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)";
              uVar6 = 0x7ff8000000000000;
              uVar2 = 0x79a;
              goto LAB_0083e747;
            }
            if (local_4 == 0) {
              dVar5 = StrToD("123e",4,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 123.0) || (NAN(dVar5))) {
                pcVar1 = "123.0";
                pcVar3 = "StrToD(\"123e\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x405ec00000000000;
                uVar2 = 0x7a0;
                goto LAB_0083e747;
              }
              uVar4 = (ulong)local_4;
              if (local_4 != 3) {
                local_4 = 3;
                pcVar1 = "processed";
                pcVar3 = "3";
                uVar2 = 0x7a1;
                goto LAB_0083e77a;
              }
              dVar5 = StrToD("123e-",4,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 123.0) || (NAN(dVar5))) {
                pcVar1 = "123.0";
                pcVar3 = "StrToD(\"123e-\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x405ec00000000000;
                uVar2 = 0x7a3;
                goto LAB_0083e747;
              }
              uVar4 = (ulong)local_4;
              if (local_4 != 3) {
                local_4 = 3;
                pcVar1 = "processed";
                pcVar3 = "3";
                uVar2 = 0x7a4;
                goto LAB_0083e77a;
              }
              dVar5 = StrToD("123e-a",4,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 123.0) || (NAN(dVar5))) {
                pcVar1 = "123.0";
                pcVar3 = "StrToD(\"123e-a\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x405ec00000000000;
                uVar2 = 0x7a6;
                goto LAB_0083e747;
              }
              uVar4 = (ulong)local_4;
              if (local_4 != 3) {
                local_4 = 3;
                pcVar1 = "processed";
                pcVar3 = "3";
                uVar2 = 0x7a7;
                goto LAB_0083e77a;
              }
              dVar5 = StrToD("",0x3c,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                pcVar1 = "0.0";
                pcVar3 = "StrToD(\"\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0;
                uVar2 = 0x7af;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7b0;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD("",0x3c,1.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 1.0) || (NAN(dVar5))) {
                pcVar1 = "1.0";
                pcVar3 = "StrToD(\"\", flags, 1.0, &processed, &all_used)";
                uVar6 = 0x3ff0000000000000;
                uVar2 = 0x7b2;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7b3;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD("  ",0x3c,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                pcVar1 = "0.0";
                pcVar3 = "StrToD(\"  \", flags, 0.0, &processed, &all_used)";
                uVar6 = 0;
                uVar2 = 0x7b5;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7b6;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD("  ",0x3c,1.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 1.0) || (NAN(dVar5))) {
                pcVar1 = "1.0";
                pcVar3 = "StrToD(\"  \", flags, 1.0, &processed, &all_used)";
                uVar6 = 0x3ff0000000000000;
                uVar2 = 0x7b8;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7b9;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD("42",0x3c,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 42.0) || (NAN(dVar5))) {
                pcVar1 = "42.0";
                pcVar3 = "StrToD(\"42\", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x4045000000000000;
                uVar2 = 0x7bb;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7bc;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD(" + 42 ",0x3c,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != 42.0) || (NAN(dVar5))) {
                pcVar1 = "42.0";
                pcVar3 = "StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)";
                uVar6 = 0x4045000000000000;
                uVar2 = 0x7be;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7bf;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD(" - 42 ",0x3c,0.0,(int *)&local_4,&local_5,0);
              if ((dVar5 != -42.0) || (NAN(dVar5))) {
                pcVar1 = "-42.0";
                pcVar3 = "StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)";
                uVar6 = 0xc045000000000000;
                uVar2 = 0x7c1;
                goto LAB_0083e747;
              }
              if (local_5 == false) {
                uVar2 = 0x7c2;
                goto LAB_0083e70e;
              }
              dVar5 = StrToD("x",0x3c,1.0,(int *)&local_4,&local_5,0);
              if (!NAN(dVar5)) {
                pcVar1 = "Double::NaN()";
                pcVar3 = "StrToD(\"x\", flags, 1.0, &processed, &all_used)";
                uVar6 = 0x7ff8000000000000;
                uVar2 = 0x7c4;
                goto LAB_0083e747;
              }
              if (local_4 == 0) {
                dVar5 = StrToD(" x",0x3c,1.0,(int *)&local_4,&local_5,0);
                if (!NAN(dVar5)) {
                  pcVar1 = "Double::NaN()";
                  pcVar3 = "StrToD(\" x\", flags, 1.0, &processed, &all_used)";
                  uVar6 = 0x7ff8000000000000;
                  uVar2 = 0x7c7;
                  goto LAB_0083e747;
                }
                if (local_4 == 0) {
                  dVar5 = StrToD("42x",0x3c,0.0,(int *)&local_4,&local_5,0);
                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                    pcVar1 = "42.0";
                    pcVar3 = "StrToD(\"42x\", flags, 0.0, &processed, &all_used)";
                    uVar6 = 0x4045000000000000;
                    uVar2 = 0x7ca;
                    goto LAB_0083e747;
                  }
                  if (local_4 != 2) {
                    uVar2 = 0x7cb;
                    goto LAB_0083de30;
                  }
                  dVar5 = StrToD("42 x",0x3c,0.0,(int *)&local_4,&local_5,0);
                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                    pcVar1 = "42.0";
                    pcVar3 = "StrToD(\"42 x\", flags, 0.0, &processed, &all_used)";
                    uVar6 = 0x4045000000000000;
                    uVar2 = 0x7cd;
                    goto LAB_0083e747;
                  }
                  if (local_4 != 3) {
                    pcVar1 = "3";
                    pcVar3 = "processed";
                    uVar2 = 0x7ce;
                    uVar4 = 3;
                    goto LAB_0083e77a;
                  }
                  dVar5 = StrToD(" + 42 x",0x3c,0.0,(int *)&local_4,&local_5,0);
                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                    pcVar1 = "42.0";
                    pcVar3 = "StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)";
                    uVar6 = 0x4045000000000000;
                    uVar2 = 2000;
                    goto LAB_0083e747;
                  }
                  if (local_4 == 6) {
                    dVar5 = StrToD(" - 42 x",0x3c,0.0,(int *)&local_4,&local_5,0);
                    if ((dVar5 != -42.0) || (NAN(dVar5))) {
                      pcVar1 = "-42.0";
                      pcVar3 = "StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)";
                      uVar6 = 0xc045000000000000;
                      uVar2 = 0x7d3;
                      goto LAB_0083e747;
                    }
                    if (local_4 == 6) {
                      dVar5 = StrToD("",0x2c,0.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 0.0) || (NAN(dVar5))) {
                        pcVar1 = "0.0";
                        pcVar3 = "StrToD(\"\", flags, 0.0, &processed, &all_used)";
                        uVar6 = 0;
                        uVar2 = 0x7db;
                        goto LAB_0083e747;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x7dc;
                        goto LAB_0083e70e;
                      }
                      dVar5 = StrToD("",0x2c,1.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 1.0) || (NAN(dVar5))) {
                        pcVar1 = "1.0";
                        pcVar3 = "StrToD(\"\", flags, 1.0, &processed, &all_used)";
                        uVar6 = 0x3ff0000000000000;
                        uVar2 = 0x7de;
                        goto LAB_0083e747;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x7df;
                        goto LAB_0083e70e;
                      }
                      dVar5 = StrToD("  ",0x2c,0.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 0.0) || (NAN(dVar5))) {
                        pcVar1 = "0.0";
                        pcVar3 = "StrToD(\"  \", flags, 0.0, &processed, &all_used)";
                        uVar6 = 0;
                        uVar2 = 0x7e1;
                        goto LAB_0083e747;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x7e2;
                        goto LAB_0083e70e;
                      }
                      dVar5 = StrToD("  ",0x2c,1.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 1.0) || (NAN(dVar5))) {
                        pcVar1 = "1.0";
                        pcVar3 = "StrToD(\"  \", flags, 1.0, &processed, &all_used)";
                        uVar6 = 0x3ff0000000000000;
                        uVar2 = 0x7e4;
                        goto LAB_0083e747;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x7e5;
                        goto LAB_0083e70e;
                      }
                      dVar5 = StrToD("42",0x2c,0.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 42.0) || (NAN(dVar5))) {
                        pcVar1 = "42.0";
                        pcVar3 = "StrToD(\"42\", flags, 0.0, &processed, &all_used)";
                        uVar6 = 0x4045000000000000;
                        uVar2 = 0x7e7;
                        goto LAB_0083e747;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x7e8;
                        goto LAB_0083e70e;
                      }
                      dVar5 = StrToD(" + 42 ",0x2c,0.0,(int *)&local_4,&local_5,0);
                      if ((dVar5 != 42.0) || (NAN(dVar5))) {
                        pcVar1 = "42.0";
                        pcVar3 = "StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)";
                        uVar6 = 0x4045000000000000;
                        uVar2 = 0x7ea;
                        goto LAB_0083e747;
                      }
                      if (local_4 == 5) {
                        dVar5 = StrToD(" - 42 ",0x2c,0.0,(int *)&local_4,&local_5,0);
                        if ((dVar5 != -42.0) || (NAN(dVar5))) {
                          pcVar1 = "-42.0";
                          pcVar3 = "StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)";
                          uVar6 = 0xc045000000000000;
                          uVar2 = 0x7ed;
                          goto LAB_0083e747;
                        }
                        if (local_4 == 5) {
                          dVar5 = StrToD("x",0x2c,1.0,(int *)&local_4,&local_5,0);
                          if (!NAN(dVar5)) {
                            pcVar1 = "Double::NaN()";
                            pcVar3 = "StrToD(\"x\", flags, 1.0, &processed, &all_used)";
                            uVar6 = 0x7ff8000000000000;
                            uVar2 = 0x7f0;
                            goto LAB_0083e747;
                          }
                          if (local_4 == 0) {
                            dVar5 = StrToD(" x",0x2c,1.0,(int *)&local_4,&local_5,0);
                            if (!NAN(dVar5)) {
                              pcVar1 = "Double::NaN()";
                              pcVar3 = "StrToD(\" x\", flags, 1.0, &processed, &all_used)";
                              uVar6 = 0x7ff8000000000000;
                              uVar2 = 0x7f3;
                              goto LAB_0083e747;
                            }
                            if (local_4 == 0) {
                              dVar5 = StrToD("42x",0x2c,0.0,(int *)&local_4,&local_5,0);
                              if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                pcVar1 = "42.0";
                                pcVar3 = "StrToD(\"42x\", flags, 0.0, &processed, &all_used)";
                                uVar6 = 0x4045000000000000;
                                uVar2 = 0x7f6;
                                goto LAB_0083e747;
                              }
                              if (local_4 == 2) {
                                dVar5 = StrToD("42 x",0x2c,0.0,(int *)&local_4,&local_5,0);
                                if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                  pcVar1 = "42.0";
                                  pcVar3 = "StrToD(\"42 x\", flags, 0.0, &processed, &all_used)";
                                  uVar6 = 0x4045000000000000;
                                  uVar2 = 0x7f9;
                                  goto LAB_0083e747;
                                }
                                if (local_4 == 2) {
                                  dVar5 = StrToD(" + 42 x",0x2c,0.0,(int *)&local_4,&local_5,0);
                                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                    pcVar1 = "42.0";
                                    pcVar3 = 
                                    "StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)";
                                    uVar6 = 0x4045000000000000;
                                    uVar2 = 0x7fc;
                                    goto LAB_0083e747;
                                  }
                                  if (local_4 == 5) {
                                    dVar5 = StrToD(" - 42 x",0x2c,0.0,(int *)&local_4,&local_5,0);
                                    if ((dVar5 != -42.0) || (NAN(dVar5))) {
                                      pcVar1 = "-42.0";
                                      pcVar3 = 
                                      "StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)";
                                      uVar6 = 0xc045000000000000;
                                      uVar2 = 0x7ff;
                                      goto LAB_0083e747;
                                    }
                                    if (local_4 == 5) {
                                      dVar5 = StrToD(" +42 ",0xc,0.0,(int *)&local_4,&local_5,0);
                                      if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                        pcVar1 = "42.0";
                                        pcVar3 = 
                                        "StrToD(\" +42 \", flags, 0.0, &processed, &all_used)";
                                        uVar6 = 0x4045000000000000;
                                        uVar2 = 0x805;
                                        goto LAB_0083e747;
                                      }
                                      if (local_4 == 4) {
                                        dVar5 = StrToD(" -42 ",0xc,0.0,(int *)&local_4,&local_5,0);
                                        if ((dVar5 != -42.0) || (NAN(dVar5))) {
                                          pcVar1 = "-42.0";
                                          pcVar3 = 
                                          "StrToD(\" -42 \", flags, 0.0, &processed, &all_used)";
                                          uVar6 = 0xc045000000000000;
                                          uVar2 = 0x808;
                                          goto LAB_0083e747;
                                        }
                                        if (local_4 == 4) {
                                          dVar5 = StrToD(" + 42 ",0xc,0.0,(int *)&local_4,&local_5,0
                                                        );
                                          if (!NAN(dVar5)) {
                                            pcVar1 = "Double::NaN()";
                                            pcVar3 = 
                                            "StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)";
                                            uVar6 = 0x7ff8000000000000;
                                            uVar2 = 0x80b;
                                            goto LAB_0083e747;
                                          }
                                          if (local_4 == 0) {
                                            dVar5 = StrToD(" - 42 ",0xc,0.0,(int *)&local_4,&local_5
                                                           ,0);
                                            if (!NAN(dVar5)) {
                                              pcVar1 = "Double::NaN()";
                                              pcVar3 = 
                                              "StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)"
                                              ;
                                              uVar6 = 0x7ff8000000000000;
                                              uVar2 = 0x80e;
                                              goto LAB_0083e747;
                                            }
                                            if (local_4 == 0) {
                                              dVar5 = StrToD("",0,0.0,(int *)&local_4,&local_5,0);
                                              if ((dVar5 != 0.0) || (NAN(dVar5))) {
                                                pcVar1 = "0.0";
                                                pcVar3 = 
                                                "StrToD(\"\", flags, 0.0, &processed, &all_used)";
                                                uVar6 = 0;
                                                uVar2 = 0x814;
                                                goto LAB_0083e747;
                                              }
                                              if (local_5 == false) {
                                                uVar2 = 0x815;
                                                goto LAB_0083e70e;
                                              }
                                              dVar5 = StrToD("",0,1.0,(int *)&local_4,&local_5,0);
                                              if ((dVar5 != 1.0) || (NAN(dVar5))) {
                                                pcVar1 = "1.0";
                                                pcVar3 = 
                                                "StrToD(\"\", flags, 1.0, &processed, &all_used)";
                                                uVar6 = 0x3ff0000000000000;
                                                uVar2 = 0x817;
                                                goto LAB_0083e747;
                                              }
                                              if (local_5 == false) {
                                                uVar2 = 0x818;
                                                goto LAB_0083e70e;
                                              }
                                              dVar5 = StrToD("  ",0,0.0,(int *)&local_4,&local_5,0);
                                              if (!NAN(dVar5)) {
                                                pcVar1 = "Double::NaN()";
                                                pcVar3 = 
                                                "StrToD(\"  \", flags, 0.0, &processed, &all_used)";
                                                uVar6 = 0x7ff8000000000000;
                                                uVar2 = 0x81a;
                                                goto LAB_0083e747;
                                              }
                                              if (local_4 == 0) {
                                                dVar5 = StrToD("  ",0,1.0,(int *)&local_4,&local_5,0
                                                              );
                                                if (!NAN(dVar5)) {
                                                  pcVar1 = "Double::NaN()";
                                                  pcVar3 = 
                                                  "StrToD(\"  \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x81d;
                                                  goto LAB_0083e747;
                                                }
                                                if (local_4 == 0) {
                                                  dVar5 = StrToD("42",0,0.0,(int *)&local_4,&local_5
                                                                 ,0);
                                                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                                    pcVar1 = "42.0";
                                                    pcVar3 = 
                                                  "StrToD(\"42\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x4045000000000000;
                                                  uVar2 = 0x820;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x821;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD(" + 42 ",0,0.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if (!NAN(dVar5)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\" + 42 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x823;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" - 42 ",0,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 42 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x826;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD("x",0,1.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\"x\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x829;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" x",0,1.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" x\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x82c;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD("42x",0,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\"42x\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x82f;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD("42 x",0,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\"42 x\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x832;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" + 42 x",0,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" + 42 x\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x835;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" - 42 x",0,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar5)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 42 x\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x838;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" ",8,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if ((dVar5 != 0.0) || (NAN(dVar5))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD(\" \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0;
                                                  uVar2 = 0x83e;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x83f;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD(" ",8,1.0,(int *)&local_4,&local_5,
                                                                 0);
                                                  if ((dVar5 != 1.0) || (NAN(dVar5))) {
                                                    pcVar1 = "1.0";
                                                    pcVar3 = 
                                                  "StrToD(\" \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x3ff0000000000000;
                                                  uVar2 = 0x841;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x842;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD(" 42",8,0.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                                    pcVar1 = "42.0";
                                                    pcVar3 = 
                                                  "StrToD(\" 42\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x4045000000000000;
                                                  uVar2 = 0x844;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x845;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD("42 ",8,0.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if (!NAN(dVar5)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\"42 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x847;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar5 = StrToD(" ",0x10,0.0,(int *)&local_4,
                                                                   &local_5,0);
                                                    if ((dVar5 != 0.0) || (NAN(dVar5))) {
                                                      pcVar1 = "0.0";
                                                      pcVar3 = 
                                                  "StrToD(\" \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0;
                                                  uVar2 = 0x84d;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x84e;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD(" ",0x10,1.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if ((dVar5 != 1.0) || (NAN(dVar5))) {
                                                    pcVar1 = "1.0";
                                                    pcVar3 = 
                                                  "StrToD(\" \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x3ff0000000000000;
                                                  uVar2 = 0x850;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x851;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD("42 ",0x10,0.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if ((dVar5 != 42.0) || (NAN(dVar5))) {
                                                    pcVar1 = "42.0";
                                                    pcVar3 = 
                                                  "StrToD(\"42 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x4045000000000000;
                                                  uVar2 = 0x853;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x854;
                                                    goto LAB_0083e70e;
                                                  }
                                                  dVar5 = StrToD(" 42",0x10,0.0,(int *)&local_4,
                                                                 &local_5,0);
                                                  if (!NAN(dVar5)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\" 42\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar6 = 0x7ff8000000000000;
                                                  uVar2 = 0x856;
                                                  goto LAB_0083e747;
                                                  }
                                                  if (local_4 == 0) {
                                                    return;
                                                  }
                                                  uVar2 = 0x857;
                                                  }
                                                  else {
                                                    uVar2 = 0x848;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x839;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x836;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x833;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x830;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x82d;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x82a;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x827;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x824;
                                                  }
                                                }
                                                else {
                                                  uVar2 = 0x81e;
                                                }
                                              }
                                              else {
                                                uVar2 = 0x81b;
                                              }
                                            }
                                            else {
                                              uVar2 = 0x80f;
                                            }
                                          }
                                          else {
                                            uVar2 = 0x80c;
                                          }
                                          goto LAB_0083e777;
                                        }
                                        uVar2 = 0x809;
                                      }
                                      else {
                                        uVar2 = 0x806;
                                      }
                                      pcVar3 = "processed";
                                      pcVar1 = "4";
                                      uVar4 = 4;
                                      goto LAB_0083e77a;
                                    }
                                    uVar2 = 0x800;
                                  }
                                  else {
                                    uVar2 = 0x7fd;
                                  }
                                  goto LAB_0083dee9;
                                }
                                uVar2 = 0x7fa;
                              }
                              else {
                                uVar2 = 0x7f7;
                              }
LAB_0083de30:
                              pcVar3 = "processed";
                              pcVar1 = "2";
                              uVar4 = 2;
                              goto LAB_0083e77a;
                            }
                            uVar2 = 0x7f4;
                          }
                          else {
                            uVar2 = 0x7f1;
                          }
                          goto LAB_0083e777;
                        }
                        uVar2 = 0x7ee;
                      }
                      else {
                        uVar2 = 0x7eb;
                      }
LAB_0083dee9:
                      pcVar3 = "processed";
                      pcVar1 = "5";
                      uVar4 = 5;
                      goto LAB_0083e77a;
                    }
                    uVar2 = 0x7d4;
                  }
                  else {
                    uVar2 = 0x7d1;
                  }
                  pcVar3 = "processed";
                  pcVar1 = "6";
                  uVar4 = 6;
                  goto LAB_0083e77a;
                }
                uVar2 = 0x7c8;
              }
              else {
                uVar2 = 0x7c5;
              }
            }
            else {
              uVar2 = 0x79b;
            }
          }
          else {
            uVar2 = 0x798;
          }
        }
        else {
          uVar2 = 0x795;
        }
      }
      else {
        uVar2 = 0x792;
      }
    }
    else {
      uVar2 = 0x78f;
    }
  }
  else {
    uVar2 = 0x78c;
  }
LAB_0083e777:
  pcVar3 = "processed";
  pcVar1 = "0";
  uVar4 = 0;
LAB_0083e77a:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,pcVar1,pcVar3,uVar4,local_4);
  abort();
}

Assistant:

TEST(StringToDoubleVarious) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(123.0, StrToD("123e", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-a", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(42.0, StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0, StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0, StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(5, processed);

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(42.0, StrToD(" +42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(-42.0, StrToD(" -42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("  ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("  ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0, StrToD("42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" x", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" + 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" - 42 x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD(" 42", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("42 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0, StrToD("42 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 42", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);
}